

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

timestamp_t __thiscall duckdb::StrpTimeFormat::ParseResult::ToTimestamp(ParseResult *this)

{
  date_t date;
  timestamp_t tVar1;
  dtime_t time;
  
  if (this->is_special != true) {
    date = Date::FromDate(this->data[0],this->data[1],this->data[2]);
    time = ToTime(this);
LAB_014f4f1b:
    tVar1 = Timestamp::FromDatetime(date,time);
    return (timestamp_t)tVar1.value;
  }
  tVar1.value = 0x7fffffffffffffff;
  date.days = (this->special).days;
  if (date.days == -0x7fffffff) {
    tVar1.value = -0x7fffffffffffffff;
  }
  else if (date.days != 0x7fffffff) {
    time.micros = 0;
    goto LAB_014f4f1b;
  }
  return (timestamp_t)tVar1.value;
}

Assistant:

timestamp_t StrpTimeFormat::ParseResult::ToTimestamp() {
	if (is_special) {
		if (special == date_t::infinity()) {
			return timestamp_t::infinity();
		} else if (special == date_t::ninfinity()) {
			return timestamp_t::ninfinity();
		}
		return Timestamp::FromDatetime(special, dtime_t(0));
	}

	date_t date = ToDate();
	dtime_t time = ToTime();
	return Timestamp::FromDatetime(date, time);
}